

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O3

void __thiscall Test_aistr_length_static_Test::TestBody(Test_aistr_length_static_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  char buf [10];
  AssertHelper local_38;
  AssertHelper local_30;
  Message local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  undefined8 local_18;
  undefined2 local_10;
  
  local_10._0_1_ = '\0';
  local_10._1_1_ = '\0';
  local_18._0_1_ = '\0';
  local_18._1_1_ = '\0';
  local_18._2_1_ = '\0';
  local_18._3_1_ = '\0';
  local_18._4_1_ = '\0';
  local_18._5_1_ = '\0';
  local_18._6_1_ = '\0';
  local_18._7_1_ = '\0';
  local_38.data_ = (AssertHelperData *)ai::length<10ul>((char (*) [10])&local_18);
  local_30.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_28,"ai::length(buf)","0",(unsigned_long *)&local_38,(int *)&local_30
            );
  if (local_28.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_38.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_38.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_18._0_5_ = 0x34333231;
    local_38.data_ = (AssertHelperData *)ai::length<10ul>((char (*) [10])&local_18);
    local_30.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&local_28,"ai::length(buf)","4",(unsigned_long *)&local_38,
               (int *)&local_30);
    if (local_28.ss_.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x35,pcVar2);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (local_38.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_38.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_38.data_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_18._0_1_ = '1';
      local_18._1_1_ = '2';
      local_18._2_1_ = '3';
      local_18._3_1_ = '4';
      local_18._4_1_ = '5';
      local_18._5_1_ = '6';
      local_18._6_1_ = '7';
      local_18._7_1_ = '8';
      local_10._0_1_ = '9';
      local_10._1_1_ = '\0';
      local_38.data_ = (AssertHelperData *)ai::length<10ul>((char (*) [10])&local_18);
      local_30.data_._0_4_ = 9;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&local_28,"ai::length(buf)","9",(unsigned_long *)&local_38,
                 (int *)&local_30);
      if (local_28.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_20.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x37,pcVar2);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if (local_38.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_38.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_38.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_10 = CONCAT11(0x30,(char)local_10);
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          ai::length<10ul>((char (*) [10])&local_18);
        }
        testing::Message::Message(&local_28);
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x3c,
                   "Expected: ai::length(buf) throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                  );
        testing::internal::AssertHelper::operator=(&local_38,&local_28);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) + 8))();
          }
        }
        local_10 = local_10 & 0xff;
        local_38.data_ = (AssertHelperData *)ai::length<10ul>((char (*) [10])&local_18);
        local_30.data_._0_4_ = 9;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&local_28,"ai::length(buf)","9",(unsigned_long *)&local_38,
                   (int *)&local_30);
        if (local_28.ss_.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_38);
          if (local_20.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x3f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if (local_38.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_38.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_38.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, length_static) {
    char buf[10] = {0};
    ASSERT_EQ(ai::length(buf), 0);

#ifdef _MSC_VER
    strcpy_s(buf, "1234");
    ASSERT_EQ(ai::length(buf), 4);
    strcpy_s(buf, "123456789");
    ASSERT_EQ(ai::length(buf), 9);
#else
    strcpy(buf, "1234");
    ASSERT_EQ(ai::length(buf), 4);
    strcpy(buf, "123456789");
    ASSERT_EQ(ai::length(buf), 9);
#endif

    // make buffer without last null-terminated char
    buf[9] = '0';
    EXPECT_THROW(ai::length(buf), std::out_of_range);

    buf[9] = '\0';
    ASSERT_EQ(ai::length(buf), 9);
}